

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O2

void __thiscall
Assimp::LWSImporter::InternReadFile
          (LWSImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  size_t *psVar1;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  pointer __src;
  pointer ppaVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined4 extraout_var;
  Logger *pLVar12;
  aiScene *this_00;
  aiNode *this_01;
  aiNode **ppaVar13;
  aiNode *this_02;
  aiAnimation **ppaVar14;
  aiAnimation *this_03;
  aiNodeAnim **__dest;
  DeadlyImportError *pDVar15;
  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *plVar16;
  LWSImporter *dad;
  _List_node_base *p_Var17;
  iterator __tmp;
  char *message;
  LWSImporter *pLVar18;
  undefined8 in_R8;
  ulong uVar19;
  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *plVar20;
  uint uVar21;
  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *plVar22;
  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> *plVar23;
  ai_real aVar24;
  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> nodes;
  FlipWindingOrderProcess flipper;
  BatchLoader batch;
  PropertyMap props;
  uint local_1ec;
  const_iterator local_1e8;
  ulong local_1e0;
  aiCamera **cams;
  aiScene *pScene_local;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims;
  aiLight **lights;
  undefined8 *local_188;
  _List_node_base *local_180;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> attach;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  undefined8 local_150;
  uint local_148;
  char *local_140;
  _List_node_base local_138;
  size_t local_128;
  undefined1 auStack_120 [16];
  undefined1 local_110 [16];
  undefined8 local_100;
  undefined8 local_f8;
  _List_node_base local_f0;
  undefined8 local_e0 [3];
  MakeLeftHandedProcess monster_cheat;
  vector<char,_std::allocator<char>_> mBuffer;
  char *dummy;
  Element root;
  IOStream *stream;
  
  plVar22 = &nodes;
  plVar16 = &nodes;
  plVar23 = &nodes;
  this->io = pIOHandler;
  pScene_local = pScene;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&props,"rb",(allocator<char> *)&attach);
  iVar7 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,props.ints._M_t._M_impl._0_8_);
  stream = (IOStream *)CONCAT44(extraout_var,iVar7);
  std::__cxx11::string::~string((string *)&props);
  if (stream == (IOStream *)0x0) {
    pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attach,
                   "Failed to open LWS file ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&props,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attach,".")
    ;
    DeadlyImportError::DeadlyImportError(pDVar15,(string *)&props);
    __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  BaseImporter::TextFileToBuffer(stream,&mBuffer,FORBID_EMPTY);
  LWS::Element::Element(&root);
  dummy = mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start;
  LWS::Element::Parse(&root,&dummy);
  BatchLoader::BatchLoader(&batch,pIOHandler,false);
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node._M_size = 0;
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&nodes;
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&nodes;
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (root.children.
                           super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>
                           ._M_impl._M_node.super__List_node_base._M_next + 1),"LWMO");
  bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (root.children.
                           super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>
                           ._M_impl._M_node.super__List_node_base._M_next + 1),"LWSC");
  if ((!bVar5) && (bVar6)) {
    pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&props,"LWS: Not a LightWave scene, magic tag LWSC not found",
               (allocator<char> *)&attach);
    DeadlyImportError::DeadlyImportError(pDVar15,(string *)&props);
    __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var17 = (root.children.
             super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>._M_impl.
             _M_node.super__List_node_base._M_next)->_M_next;
  local_1e8._M_node = p_Var17;
  uVar8 = strtoul10((char *)p_Var17[1]._M_next,(char **)0x0);
  pLVar12 = DefaultLogger::get();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&props,
                 "LWS file format version is ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var17 + 1))
  ;
  Logger::info(pLVar12,(char *)props.ints._M_t._M_impl._0_8_);
  std::__cxx11::string::~string((string *)&props);
  this->first = 0.0;
  this->last = 60.0;
  this->fps = 25.0;
  psVar1 = &props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_Var2 = &props.matrices._M_t._M_impl.super__Rb_tree_header;
  local_180 = &local_f0;
  local_188 = local_e0;
  local_1e0 = 0;
  local_1ec = 0;
  uVar11 = 0;
  uVar21 = 0;
  uVar3 = 0;
  do {
    if (local_1e8._M_node == (_List_node_base *)&root.children) {
      while (uVar19 = local_1e0,
            plVar22 = *(list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> **)
                       plVar22, plVar22 != &nodes) {
        plVar20 = &nodes;
        while (plVar20 = *(list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> **)
                          plVar20, plVar20 != &nodes) {
          if ((plVar20 != plVar22) &&
             (bVar5 = LWS::NodeDesc::operator==
                                ((NodeDesc *)((long)plVar22 + 0x10),*(uint *)((long)plVar20 + 0x40))
             , bVar5)) {
            if (*(long *)((long)plVar20 + 0xb0) == 0) {
              props.ints._M_t._M_impl._0_8_ = (long)plVar20 + 0x10;
              std::__cxx11::list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
              ::push_back((list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_> *
                          )((long)plVar22 + 0x98),(value_type *)&props);
              *(NodeDesc **)((long)plVar20 + 0xb0) = (NodeDesc *)((long)plVar22 + 0x10);
            }
            else {
              pLVar12 = DefaultLogger::get();
              Logger::error(pLVar12,"LWS: Found cross reference in scene-graph");
            }
          }
        }
      }
      uVar11 = 0;
      while (plVar16 = *(list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> **)
                        plVar16, plVar16 != &nodes) {
        uVar11 = uVar11 + (*(long *)((long)plVar16 + 0xb0) == 0);
      }
      if (uVar11 == 0) {
        pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&props,"LWS: Unable to find scene root node",(allocator<char> *)&attach
                  );
        DeadlyImportError::DeadlyImportError(pDVar15,(string *)&props);
        __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      BatchLoader::LoadAll(&batch);
      this_00 = (aiScene *)operator_new(0x80);
      aiScene::aiScene(this_00);
      this_01 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_01);
      this_00->mRootNode = this_01;
      uVar21 = (uint)uVar19;
      if (uVar21 == 0) {
        cams = this_00->mCameras;
      }
      else {
        this_00->mNumCameras = uVar21;
        cams = (aiCamera **)operator_new__((uVar19 & 0xffffffff) << 3);
        this_00->mCameras = cams;
      }
      if (local_1ec == 0) {
        lights = this_00->mLights;
      }
      else {
        this_00->mNumLights = local_1ec;
        lights = (aiLight **)operator_new__((ulong)local_1ec << 3);
        this_00->mLights = lights;
      }
      attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      aiString::Set((aiString *)this_01,"<LWSRoot>");
      ppaVar13 = (aiNode **)operator_new__((ulong)uVar11 << 3);
      this_01->mChildren = ppaVar13;
      while (plVar23 = *(list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> **)
                        plVar23, plVar23 != &nodes) {
        if (*(long *)((long)plVar23 + 0xb0) == 0) {
          this_02 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(this_02);
          uVar11 = this_01->mNumChildren;
          this_01->mNumChildren = uVar11 + 1;
          this_01->mChildren[uVar11] = this_02;
          this_02->mParent = this_01;
          BuildGraph(this,this_02,(NodeDesc *)((long)plVar23 + 0x10),&attach,&batch,&cams,&lights,
                     &anims);
        }
      }
      if (anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        this_00->mNumAnimations = 1;
        ppaVar14 = (aiAnimation **)operator_new__(8);
        this_00->mAnimations = ppaVar14;
        this_03 = (aiAnimation *)operator_new(0x448);
        aiAnimation::aiAnimation(this_03);
        *this_00->mAnimations = this_03;
        aiString::Set((aiString *)this_03,"LWSMasterAnim");
        ppaVar4 = anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        __src = anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                super__Vector_impl_data._M_start;
        this_03->mTicksPerSecond = this->fps;
        this_03->mDuration = this->last - (this->first + -1.0);
        uVar19 = (long)anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
        this_03->mNumChannels = (uint)(uVar19 >> 3);
        __dest = (aiNodeAnim **)operator_new__(uVar19 & 0x7fffffff8);
        this_03->mChannels = __dest;
        if (ppaVar4 != __src) {
          memmove(__dest,__src,uVar19);
        }
      }
      MakeLeftHandedProcess::MakeLeftHandedProcess(&monster_cheat);
      MakeLeftHandedProcess::Execute(&monster_cheat,this_00);
      FlipWindingOrderProcess::FlipWindingOrderProcess(&flipper);
      FlipWindingOrderProcess::Execute(&flipper,this_00);
      uVar11 = 0x13;
      if (this->configSpeedFlag != false) {
        uVar11 = 1;
      }
      SceneCombiner::MergeScenes(&pScene_local,this_00,&attach,uVar11);
      if ((((pScene_local->mNumMeshes == 0) || (pScene_local->mNumMaterials == 0)) &&
          (*(byte *)&pScene_local->mFlags = (byte)pScene_local->mFlags | 1,
          pScene_local->mNumAnimations != 0)) && (this->noSkeletonMesh == false)) {
        SkeletonMeshBuilder::SkeletonMeshBuilder
                  ((SkeletonMeshBuilder *)&props,pScene_local,(aiNode *)0x0,false);
        SkeletonMeshBuilder::~SkeletonMeshBuilder((SkeletonMeshBuilder *)&props);
      }
      FlipWindingOrderProcess::~FlipWindingOrderProcess(&flipper);
      MakeLeftHandedProcess::~MakeLeftHandedProcess(&monster_cheat);
      std::_Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::~_Vector_base
                (&anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>);
      std::_Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
      ~_Vector_base(&attach.
                     super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                   );
      std::__cxx11::_List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
      _M_clear(&nodes.
                super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>);
      BatchLoader::~BatchLoader(&batch);
      LWS::Element::~Element(&root);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&mBuffer.super__Vector_base<char,_std::allocator<char>_>);
      (*stream->_vptr_IOStream[1])();
      return;
    }
    flipper.super_BaseProcess._vptr_BaseProcess = (_func_int **)local_1e8._M_node[3]._M_next;
    dad = (LWSImporter *)(local_1e8._M_node + 1);
    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dad
                            ,"FirstFrame");
    if (bVar6) {
      if ((this->first != 150392.0) || (NAN(this->first))) {
        uVar9 = strtoul10((char *)flipper.super_BaseProcess._vptr_BaseProcess,(char **)&flipper);
        this->first = (double)uVar9 + -1.0;
      }
    }
    else {
      bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              dad,"LastFrame");
      if (bVar6) {
        if ((this->last != 150392.0) || (NAN(this->last))) {
          uVar9 = strtoul10((char *)flipper.super_BaseProcess._vptr_BaseProcess,(char **)&flipper);
          this->last = (double)uVar9 + -1.0;
        }
      }
      else {
        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )dad,"FramesPerSecond");
        if (bVar6) {
          uVar9 = strtoul10((char *)flipper.super_BaseProcess._vptr_BaseProcess,(char **)&flipper);
          this->fps = (double)uVar9;
        }
        else {
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)dad,"LoadObjectLayer");
          if (bVar6) {
            uVar9 = strtoul10((char *)flipper.super_BaseProcess._vptr_BaseProcess,(char **)&flipper)
            ;
            props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
            props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &props.ints._M_t._M_impl.super__Rb_tree_header._M_header;
            props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                 0xffffffff00000000;
            props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &props.floats._M_t._M_impl.super__Rb_tree_header._M_header;
            props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._0_5_ = 0;
            props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
            props.strings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 props.strings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                 0xffffffff00000000;
            props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &props.strings._M_t._M_impl.super__Rb_tree_header._M_header;
            props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            cams = (aiCamera **)CONCAT44(cams._4_4_,uVar9);
            props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            props.matrices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
            ;
            props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var2->_M_header;
            SetGenericProperty<int>(&props.ints,"IMPORT_LWO_ONE_LAYER_ONLY",(int *)&cams);
            attach.
            super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_160;
            attach.
            super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_160._M_local_buf[0] = '\0';
            local_150._0_4_ = 0;
            local_150._4_4_ = 0;
            local_148 = 0;
            local_140 = "";
            local_138._M_next = &local_138;
            local_128 = 0;
            auStack_120._0_5_ = 0;
            auStack_120._5_3_ = 0;
            auStack_120._8_4_ = 0.0;
            auStack_120[0xc] = false;
            local_100._0_4_ = 0;
            local_100._4_4_ = 0;
            local_110._0_4_ = 1.0;
            local_110._4_4_ = 1.0;
            local_110._8_4_ = 1.0;
            local_110._12_4_ = 1.0;
            local_f8._0_4_ = 45.0;
            local_f8._4_4_ = 0.0;
            local_f0._M_prev = local_180;
            local_f0._M_next = &local_f0;
            *local_188 = 0;
            local_188[1] = 0;
            attach.
            super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(attach.
                                   super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
            local_138._M_prev = local_138._M_next;
            if (uVar8 < 4) {
              uVar9 = uVar11 + 1;
              uVar10 = uVar11;
            }
            else {
              SkipSpaces<char>((char **)&flipper);
              uVar9 = strtoul16((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                (char **)&flipper);
              uVar10 = uVar9 & 0xfffffff;
              uVar9 = uVar11;
            }
            local_150._4_4_ = uVar10;
            SkipSpaces<char>((char **)&flipper);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&monster_cheat,(char *)flipper.super_BaseProcess._vptr_BaseProcess,
                       (allocator<char> *)&lights);
            FindLWOFile((string *)&anims,this,(string *)&monster_cheat);
            std::__cxx11::string::~string((string *)&monster_cheat);
            std::__cxx11::string::_M_assign
                      ((string *)
                       &attach.
                        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
            local_150._0_4_ = BatchLoader::AddLoadRequest(&batch,(string *)&anims,0,&props);
            std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
            push_back(&nodes,(value_type *)&attach);
            std::__cxx11::string::~string((string *)&anims);
            LWS::NodeDesc::~NodeDesc((NodeDesc *)&attach);
            BatchLoader::PropertyMap::~PropertyMap(&props);
            uVar11 = uVar9;
          }
          else {
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)dad,"LoadObject");
            if (bVar6) {
              props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)
                   ((ulong)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
                   0xffffffffffffff00);
              props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              props.floats._M_t._M_impl._0_8_ = props.floats._M_t._M_impl._0_8_ & 0xffffffff00000000
              ;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (long)" \t" + 2;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)&props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._0_5_ = 0;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
              props.strings._M_t._M_impl._0_5_ = 0;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x3f800000;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x3f8000003f800000;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)0x42340000;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   (size_t)&props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count;
              props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
              ;
              props.ints._M_t._M_impl._0_4_ = 1;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              if (uVar8 < 4) {
                props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = (ulong)uVar11 << 0x20;
                uVar11 = uVar11 + 1;
                props.matrices._M_t._M_impl._0_8_ = psVar1;
              }
              else {
                props.matrices._M_t._M_impl._0_8_ = psVar1;
                uVar9 = strtoul16((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                  (char **)&flipper);
                props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     CONCAT44(uVar9,(undefined4)
                                    props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count) &
                     0xfffffffffffffff;
                SkipSpaces<char>((char **)&flipper);
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&anims,(char *)flipper.super_BaseProcess._vptr_BaseProcess,
                         (allocator<char> *)&monster_cheat);
              FindLWOFile((string *)&attach,this,(string *)&anims);
              std::__cxx11::string::~string((string *)&anims);
              uVar9 = BatchLoader::AddLoadRequest(&batch,(string *)&attach,0,(PropertyMap *)0x0);
              props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   CONCAT44(props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,uVar9)
              ;
              std::__cxx11::string::_M_assign
                        ((string *)&props.ints._M_t._M_impl.super__Rb_tree_header);
              std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
              push_back(&nodes,(value_type *)&props);
              std::__cxx11::string::~string((string *)&attach);
            }
            else {
              bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)dad,"AddNullObject");
              if (!bVar6) {
                bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)dad,"NumChannels");
                if (!bVar6) {
                  bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)dad,"Channel");
                  if (bVar6) {
                    if (nodes.
                        super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                        ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&nodes)
                    {
                      if (bVar5) {
                        props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                             &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                        props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                             (_Base_ptr)0x0;
                        props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                             (_Base_ptr)
                             ((ulong)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                             & 0xffffffffffffff00);
                        props.floats._M_t._M_impl._0_8_ =
                             props.floats._M_t._M_impl._0_8_ & 0xffffffff00000000;
                        props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                             (_Base_ptr)
                             &props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                        props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                             (_Base_ptr)0x0;
                        props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._0_5_ = 0;
                        props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
                        props.strings._M_t._M_impl._0_5_ = 0;
                        props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                             0x3f800000;
                        props.strings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
                             0x3f800000;
                        props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                             (_Base_ptr)0x3f8000003f800000;
                        props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                             (_Base_ptr)0x0;
                        props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                             (_Base_ptr)0x42340000;
                        props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count =
                             (size_t)&props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count
                        ;
                        props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                             _S_red;
                        props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                             (_Base_ptr)0x0;
                        props.ints._M_t._M_impl._0_4_ = 1;
                        props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                             flipper.super_BaseProcess._vptr_BaseProcess;
                        props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count =
                             (ulong)uVar11 << 0x20;
                        props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                             props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                        props.matrices._M_t._M_impl._0_8_ = psVar1;
                        std::__cxx11::
                        list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
                        push_back(&nodes,(value_type *)&props);
                        uVar11 = uVar11 + 1;
                        LWS::NodeDesc::~NodeDesc((NodeDesc *)&props);
                      }
                      pLVar12 = DefaultLogger::get();
                      Logger::error(pLVar12,"LWS: Unexpected keyword: \'Channel\'");
                    }
                    props.ints._M_t._M_impl._0_8_ = 0x1000000000;
                    props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
                    props.ints._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
                    props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                         (_Base_ptr)0x0;
                    props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                    props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)0x0;
                    props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0
                    ;
                    props.floats._M_t._M_impl._0_8_ = 0;
                    std::__cxx11::
                    list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::push_back
                              ((list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                                *)(nodes.
                                   super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                   ._M_impl._M_node.super__List_node_base._M_prev + 5),
                               (value_type *)&props);
                    std::_Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::
                    ~_Vector_base((_Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                   *)&props.ints._M_t._M_impl.super__Rb_tree_header._M_header.
                                      _M_parent);
                    p_Var17 = nodes.
                              super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                              ._M_impl._M_node.super__List_node_base._M_prev[5]._M_prev;
                    uVar9 = strtoul10((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                      (char **)0x0);
                    *(uint *)&p_Var17[1]._M_next = uVar9;
                    *(uint *)((long)&p_Var17[1]._M_next + 4) = uVar9 + 1;
                  }
                  else {
                    pLVar18 = dad;
                    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)dad,"Envelope");
                    if (bVar6) {
                      if ((nodes.
                           super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                           ._M_impl._M_node.super__List_node_base._M_next ==
                           (_List_node_base *)&nodes) ||
                         (nodes.
                          super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                          ._M_impl._M_node.super__List_node_base._M_prev[5]._M_next ==
                          nodes.
                          super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                          ._M_impl._M_node.super__List_node_base._M_prev + 5)) {
                        pLVar12 = DefaultLogger::get();
                        message = "LWS: Unexpected keyword: \'Envelope\'";
                        goto LAB_003ba92b;
                      }
                      ReadEnvelope(pLVar18,(Element *)dad,
                                   (Envelope *)
                                   (nodes.
                                    super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev[5]._M_prev + 1));
                    }
                    else if (uVar8 < 3) {
                      pLVar18 = dad;
                      bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)dad,"ObjectMotion");
                      if (((bVar6) ||
                          (pLVar18 = dad,
                          bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"CameraMotion"), bVar6)) ||
                         (pLVar18 = dad,
                         bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"LightMotion"), bVar6)) {
                        if (nodes.
                            super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                            ._M_impl._M_node.super__List_node_base._M_next ==
                            (_List_node_base *)&nodes) {
                          pLVar12 = DefaultLogger::get();
                          message = "LWS: Unexpected keyword: \'<Light|Object|Camera>Motion\'";
                          goto LAB_003ba92b;
                        }
                        props.ints._M_t._M_impl._0_8_ = &root.children;
                        ReadEnvelope_Old(pLVar18,&local_1e8,(const_iterator *)&props,
                                         (NodeDesc *)
                                         (nodes.
                                          super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                          ._M_impl._M_node.super__List_node_base._M_prev + 1),
                                         (uint)in_R8);
                      }
                      else {
                        if ((uVar8 != 2) ||
                           (bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"Pre/PostBehavior"), !bVar6))
                        goto LAB_003ba556;
                        if (nodes.
                            super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                            ._M_impl._M_node.super__List_node_base._M_next ==
                            (_List_node_base *)&nodes) {
                          pLVar12 = DefaultLogger::get();
                          message = "LWS: Unexpected keyword: \'Pre/PostBehavior\'";
                          goto LAB_003ba92b;
                        }
                        p_Var17 = nodes.
                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                  ._M_impl._M_node.super__List_node_base._M_prev + 5;
                        while (p_Var17 = p_Var17->_M_next,
                              p_Var17 !=
                              nodes.
                              super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                              ._M_impl._M_node.super__List_node_base._M_prev + 5) {
                          uVar9 = strtoul10((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                            (char **)&flipper);
                          *(uint *)&p_Var17[1]._M_prev = uVar9;
                          SkipSpaces<char>((char **)&flipper);
                          uVar9 = strtoul10((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                            (char **)&flipper);
                          *(uint *)((long)&p_Var17[1]._M_prev + 4) = uVar9;
                          SkipSpaces<char>((char **)&flipper);
                        }
                      }
                    }
                    else {
LAB_003ba556:
                      bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)dad,"ParentItem");
                      if (bVar6) {
                        if (nodes.
                            super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                            ._M_impl._M_node.super__List_node_base._M_next !=
                            (_List_node_base *)&nodes) {
                          uVar9 = strtoul16((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                            (char **)&flipper);
LAB_003ba583:
                          *(uint *)&nodes.
                                    super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev[4]._M_next =
                               uVar9;
                          goto LAB_003ba3ee;
                        }
                        pLVar12 = DefaultLogger::get();
                        message = "LWS: Unexpected keyword: \'ParentItem\'";
                      }
                      else if ((uVar8 < 3) &&
                              (bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"ParentObject"), bVar6)) {
                        if (nodes.
                            super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                            ._M_impl._M_node.super__List_node_base._M_next !=
                            (_List_node_base *)&nodes) {
                          uVar9 = strtoul10((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                            (char **)&flipper);
                          uVar9 = uVar9 | 0x10000000;
                          goto LAB_003ba583;
                        }
                        pLVar12 = DefaultLogger::get();
                        message = "LWS: Unexpected keyword: \'ParentObject\'";
                      }
                      else {
                        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)dad,"AddCamera");
                        if (bVar6) {
                          props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                               &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                          props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)0x0;
                          props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                               (_Base_ptr)
                               ((ulong)props.ints._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_left & 0xffffffffffffff00);
                          props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                          props.floats._M_t._M_impl._0_8_ =
                               props.floats._M_t._M_impl._0_8_ & 0xffffffff00000000;
                          props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                               (long)" \t" + 2;
                          props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)
                               &props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                          props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                               (_Base_ptr)0x0;
                          props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._0_5_ = 0;
                          props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
                          props.strings._M_t._M_impl._0_5_ = 0;
                          props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                               (_Base_ptr)0x0;
                          props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                               0x3f800000;
                          props.strings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
                               0x3f800000;
                          props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)0x3f8000003f800000;
                          props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                               (_Base_ptr)0x42340000;
                          props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count =
                               (size_t)&props.strings._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count;
                          props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                               _S_red;
                          props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)0x0;
                          props.ints._M_t._M_impl._0_4_ = 3;
                          props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                               props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                          if (uVar8 < 4) {
                            uVar9 = uVar21;
                            props.matrices._M_t._M_impl._0_8_ = psVar1;
                            uVar21 = uVar21 + 1;
                          }
                          else {
                            props.matrices._M_t._M_impl._0_8_ = psVar1;
                            uVar9 = strtoul16((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                              (char **)&flipper);
                            uVar9 = uVar9 & 0xfffffff;
                          }
                          props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count =
                               CONCAT44(uVar9,(undefined4)
                                              props.ints._M_t._M_impl.super__Rb_tree_header.
                                              _M_node_count);
                          std::__cxx11::
                          list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
                          push_back(&nodes,(value_type *)&props);
                          local_1e0 = (ulong)((int)local_1e0 + 1);
                          goto LAB_003ba3e9;
                        }
                        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)dad,"CameraName");
                        if (bVar6) {
                          if ((nodes.
                               super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                               ._M_impl._M_node.super__List_node_base._M_next !=
                               (_List_node_base *)&nodes) &&
                             (*(int *)&nodes.
                                       super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                       ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next ==
                              3)) {
LAB_003ba6f7:
                            nodes.
                            super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                            ._M_impl._M_node.super__List_node_base._M_prev[4]._M_prev =
                                 (_List_node_base *)flipper.super_BaseProcess._vptr_BaseProcess;
                            goto LAB_003ba3ee;
                          }
                          pLVar12 = DefaultLogger::get();
                          message = "LWS: Unexpected keyword: \'CameraName\'";
                        }
                        else {
                          bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"AddLight");
                          if (bVar6) {
                            props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                            props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 (_Base_ptr)
                                 ((ulong)props.ints._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_left & 0xffffffffffffff00);
                            props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                            props.floats._M_t._M_impl._0_8_ =
                                 props.floats._M_t._M_impl._0_8_ & 0xffffffff00000000;
                            props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)" \t" + 2;
                            props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)
                                 &props.floats._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_parent;
                            props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                                 (_Base_ptr)0x0;
                            props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._0_5_ = 0;
                            props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
                            props.strings._M_t._M_impl._0_5_ = 0;
                            props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 (_Base_ptr)0x0;
                            props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 0x3f800000;
                            props.strings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
                                 0x3f800000;
                            props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x3f8000003f800000;
                            props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                                 (_Base_ptr)0x42340000;
                            props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count =
                                 (size_t)&props.strings._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count;
                            props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            props.ints._M_t._M_impl._0_4_ = 2;
                            props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                            ;
                            if (uVar8 < 4) {
                              uVar9 = uVar3;
                              props.matrices._M_t._M_impl._0_8_ = psVar1;
                              uVar3 = uVar3 + 1;
                            }
                            else {
                              props.matrices._M_t._M_impl._0_8_ = psVar1;
                              uVar9 = strtoul16((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                                (char **)&flipper);
                              uVar9 = uVar9 & 0xfffffff;
                            }
                            props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count =
                                 CONCAT44(uVar9,(undefined4)
                                                props.ints._M_t._M_impl.super__Rb_tree_header.
                                                _M_node_count);
                            std::__cxx11::
                            list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
                            push_back(&nodes,(value_type *)&props);
                            local_1ec = local_1ec + 1;
                            goto LAB_003ba3e9;
                          }
                          bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"LightName");
                          if (!bVar6) {
                            bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"LightIntensity");
                            if ((bVar6) ||
                               (bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"LgtIntensity"), bVar6)) {
                              if ((nodes.
                                   super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                   ._M_impl._M_node.super__List_node_base._M_next ==
                                   (_List_node_base *)&nodes) ||
                                 (*(int *)&nodes.
                                           super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                           ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next
                                  != 2)) {
                                pLVar12 = DefaultLogger::get();
                                message = "LWS: Unexpected keyword: \'LightIntensity\'";
                                goto LAB_003ba92b;
                              }
                              fast_atoreal_move<float>
                                        ((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                         (float *)((long)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[8].
                                                  _M_next + 4),true);
                            }
                            else {
                              bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"LightType");
                              if (bVar6) {
                                if ((nodes.
                                     super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                     ._M_impl._M_node.super__List_node_base._M_next ==
                                     (_List_node_base *)&nodes) ||
                                   (*(int *)&nodes.
                                             super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                             ._M_impl._M_node.super__List_node_base._M_prev[1].
                                             _M_next != 2)) {
                                  pLVar12 = DefaultLogger::get();
                                  message = "LWS: Unexpected keyword: \'LightType\'";
                                  goto LAB_003ba92b;
                                }
                                uVar9 = strtoul10((char *)flipper.super_BaseProcess.
                                                          _vptr_BaseProcess,(char **)0x0);
                                *(uint *)&nodes.
                                          super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                          ._M_impl._M_node.super__List_node_base._M_prev[8]._M_prev
                                     = uVar9;
                              }
                              else {
                                bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"LightFalloffType");
                                if (bVar6) {
                                  if ((nodes.
                                       super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                       ._M_impl._M_node.super__List_node_base._M_next ==
                                       (_List_node_base *)&nodes) ||
                                     (*(int *)&nodes.
                                               super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                               ._M_impl._M_node.super__List_node_base._M_prev[1].
                                               _M_next != 2)) {
                                    pLVar12 = DefaultLogger::get();
                                    message = "LWS: Unexpected keyword: \'LightFalloffType\'";
                                    goto LAB_003ba92b;
                                  }
                                  uVar9 = strtoul10((char *)flipper.super_BaseProcess.
                                                            _vptr_BaseProcess,(char **)0x0);
                                  *(uint *)((long)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[8].
                                                  _M_prev + 4) = uVar9;
                                }
                                else {
                                  bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"LightConeAngle");
                                  if (bVar6) {
                                    if ((nodes.
                                         super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                         ._M_impl._M_node.super__List_node_base._M_next ==
                                         (_List_node_base *)&nodes) ||
                                       (*(int *)&nodes.
                                                 super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev[1].
                                                 _M_next != 2)) {
                                      pLVar12 = DefaultLogger::get();
                                      message = "LWS: Unexpected keyword: \'LightConeAngle\'";
                                      goto LAB_003ba92b;
                                    }
                                    aVar24 = fast_atof((char *)flipper.super_BaseProcess.
                                                               _vptr_BaseProcess);
                                    *(ai_real *)
                                     &nodes.
                                      super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                      ._M_impl._M_node.super__List_node_base._M_prev[9]._M_next =
                                         aVar24;
                                  }
                                  else {
                                    bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"LightEdgeAngle");
                                    if (bVar6) {
                                      if ((nodes.
                                           super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                           ._M_impl._M_node.super__List_node_base._M_next ==
                                           (_List_node_base *)&nodes) ||
                                         (*(int *)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[1].
                                                  _M_next != 2)) {
                                        pLVar12 = DefaultLogger::get();
                                        message = "LWS: Unexpected keyword: \'LightEdgeAngle\'";
                                        goto LAB_003ba92b;
                                      }
                                      aVar24 = fast_atof((char *)flipper.super_BaseProcess.
                                                                 _vptr_BaseProcess);
                                      *(ai_real *)
                                       ((long)&nodes.
                                               super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                               ._M_impl._M_node.super__List_node_base._M_prev[9].
                                               _M_next + 4) = aVar24;
                                    }
                                    else {
                                      bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"LightColor");
                                      if (bVar6) {
                                        if ((nodes.
                                             super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                             ._M_impl._M_node.super__List_node_base._M_next ==
                                             (_List_node_base *)&nodes) ||
                                           (*(int *)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[1].
                                                  _M_next != 2)) {
                                          pLVar12 = DefaultLogger::get();
                                          message = "LWS: Unexpected keyword: \'LightColor\'";
                                          goto LAB_003ba92b;
                                        }
                                        flipper.super_BaseProcess._vptr_BaseProcess =
                                             (_func_int **)
                                             fast_atoreal_move<float>
                                                       ((char *)flipper.super_BaseProcess.
                                                                _vptr_BaseProcess,
                                                        (float *)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[7].
                                                  _M_prev,true);
                                        SkipSpaces<char>((char **)&flipper);
                                        flipper.super_BaseProcess._vptr_BaseProcess =
                                             (_func_int **)
                                             fast_atoreal_move<float>
                                                       ((char *)flipper.super_BaseProcess.
                                                                _vptr_BaseProcess,
                                                        (float *)((long)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[7].
                                                  _M_prev + 4),true);
                                        SkipSpaces<char>((char **)&flipper);
                                        flipper.super_BaseProcess._vptr_BaseProcess =
                                             (_func_int **)
                                             fast_atoreal_move<float>
                                                       ((char *)flipper.super_BaseProcess.
                                                                _vptr_BaseProcess,
                                                        (float *)(nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev + 8
                                                  ),true);
                                      }
                                      else {
                                        bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"PivotPosition");
                                        if ((bVar6) ||
                                           (bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)dad,"PivotPoint"), bVar6)) {
                                          if (nodes.
                                              super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                              ._M_impl._M_node.super__List_node_base._M_next ==
                                              (_List_node_base *)&nodes) {
                                            pLVar12 = DefaultLogger::get();
                                            message = "LWS: Unexpected keyword: \'PivotPosition\'";
                                            goto LAB_003ba92b;
                                          }
                                          flipper.super_BaseProcess._vptr_BaseProcess =
                                               (_func_int **)
                                               fast_atoreal_move<float>
                                                         ((char *)flipper.super_BaseProcess.
                                                                  _vptr_BaseProcess,
                                                          (float *)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[6].
                                                  _M_prev,true);
                                          SkipSpaces<char>((char **)&flipper);
                                          flipper.super_BaseProcess._vptr_BaseProcess =
                                               (_func_int **)
                                               fast_atoreal_move<float>
                                                         ((char *)flipper.super_BaseProcess.
                                                                  _vptr_BaseProcess,
                                                          (float *)((long)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[6].
                                                  _M_prev + 4),true);
                                          SkipSpaces<char>((char **)&flipper);
                                          flipper.super_BaseProcess._vptr_BaseProcess =
                                               (_func_int **)
                                               fast_atoreal_move<float>
                                                         ((char *)flipper.super_BaseProcess.
                                                                  _vptr_BaseProcess,
                                                          (float *)(nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev + 7
                                                  ),true);
                                          *(undefined1 *)
                                           ((long)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[7].
                                                  _M_next + 4) = 1;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            goto LAB_003ba3ee;
                          }
                          if ((nodes.
                               super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                               ._M_impl._M_node.super__List_node_base._M_next !=
                               (_List_node_base *)&nodes) &&
                             (*(int *)&nodes.
                                       super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                       ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next ==
                              2)) goto LAB_003ba6f7;
                          pLVar12 = DefaultLogger::get();
                          message = "LWS: Unexpected keyword: \'LightName\'";
                        }
                      }
LAB_003ba92b:
                      Logger::error(pLVar12,message);
                    }
                  }
                }
                goto LAB_003ba3ee;
              }
              props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)
                   ((ulong)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
                   0xffffffffffffff00);
              props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              props.floats._M_t._M_impl._0_8_ = props.floats._M_t._M_impl._0_8_ & 0xffffffff00000000
              ;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (long)" \t" + 2;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)&props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._0_5_ = 0;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
              props.strings._M_t._M_impl._0_5_ = 0;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x3f800000;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x3f8000003f800000;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)0x42340000;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   (size_t)&props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count;
              props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
              ;
              props.ints._M_t._M_impl._0_4_ = 1;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              if (uVar8 < 4) {
                props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = (ulong)uVar11 << 0x20;
                uVar11 = uVar11 + 1;
                props.matrices._M_t._M_impl._0_8_ = psVar1;
              }
              else {
                props.matrices._M_t._M_impl._0_8_ = psVar1;
                uVar9 = strtoul16((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                  (char **)&flipper);
                props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     CONCAT44(uVar9,(undefined4)
                                    props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count) &
                     0xfffffffffffffff;
                SkipSpaces<char>((char **)&flipper);
              }
              props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   flipper.super_BaseProcess._vptr_BaseProcess;
              std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
              push_back(&nodes,(value_type *)&props);
            }
LAB_003ba3e9:
            LWS::NodeDesc::~NodeDesc((NodeDesc *)&props);
          }
        }
      }
    }
LAB_003ba3ee:
    local_1e8._M_node = (local_1e8._M_node)->_M_next;
  } while( true );
}

Assistant:

void LWSImporter::InternReadFile( const std::string& pFile, aiScene* pScene,
    IOSystem* pIOHandler)
{
    io = pIOHandler;
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open LWS file " + pFile + ".");
    }

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector< char > mBuffer;
    TextFileToBuffer(file.get(),mBuffer);

    // Parse the file structure
    LWS::Element root; const char* dummy = &mBuffer[0];
    root.Parse(dummy);

    // Construct a Batchimporter to read more files recursively
    BatchLoader batch(pIOHandler);
//  batch.SetBasePath(pFile);

    // Construct an array to receive the flat output graph
    std::list<LWS::NodeDesc> nodes;

    unsigned int cur_light = 0, cur_camera = 0, cur_object = 0;
    unsigned int num_light = 0, num_camera = 0, num_object = 0;

    // check magic identifier, 'LWSC'
    bool motion_file = false;
    std::list< LWS::Element >::const_iterator it = root.children.begin();

    if ((*it).tokens[0] == "LWMO")
        motion_file = true;

    if ((*it).tokens[0] != "LWSC" && !motion_file)
        throw DeadlyImportError("LWS: Not a LightWave scene, magic tag LWSC not found");

    // get file format version and print to log
    ++it;
    unsigned int version = strtoul10((*it).tokens[0].c_str());
    ASSIMP_LOG_INFO("LWS file format version is " + (*it).tokens[0]);
    first = 0.;
    last  = 60.;
    fps   = 25.; /* seems to be a good default frame rate */

    // Now read all elements in a very straghtforward manner
    for (; it != root.children.end(); ++it) {
        const char* c = (*it).tokens[1].c_str();

        // 'FirstFrame': begin of animation slice
        if ((*it).tokens[0] == "FirstFrame") {
            if (150392. != first           /* see SetupProperties() */)
                first = strtoul10(c,&c)-1.; /* we're zero-based */
        }

        // 'LastFrame': end of animation slice
        else if ((*it).tokens[0] == "LastFrame") {
            if (150392. != last      /* see SetupProperties() */)
                last = strtoul10(c,&c)-1.; /* we're zero-based */
        }

        // 'FramesPerSecond': frames per second
        else if ((*it).tokens[0] == "FramesPerSecond") {
            fps = strtoul10(c,&c);
        }

        // 'LoadObjectLayer': load a layer of a specific LWO file
        else if ((*it).tokens[0] == "LoadObjectLayer") {

            // get layer index
            const int layer = strtoul10(c,&c);

            // setup the layer to be loaded
            BatchLoader::PropertyMap props;
            SetGenericProperty(props.ints,AI_CONFIG_IMPORT_LWO_ONE_LAYER_ONLY,layer);

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::OBJECT;
            if (version >= 4) { // handle LWSC 4 explicit ID
                SkipSpaces(&c);
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
            }
            else d.number = cur_object++;

            // and add the file to the import list
            SkipSpaces(&c);
            std::string path = FindLWOFile( c );
            d.path = path;
            d.id = batch.AddLoadRequest(path,0,&props);

            nodes.push_back(d);
            num_object++;
        }
        // 'LoadObject': load a LWO file into the scenegraph
        else if ((*it).tokens[0] == "LoadObject") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::OBJECT;

            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
                SkipSpaces(&c);
            }
            else d.number = cur_object++;
            std::string path = FindLWOFile( c );
            d.id = batch.AddLoadRequest(path,0,NULL);

            d.path = path;
            nodes.push_back(d);
            num_object++;
        }
        // 'AddNullObject': add a dummy node to the hierarchy
        else if ((*it).tokens[0] == "AddNullObject") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::OBJECT;
            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
                SkipSpaces(&c);
            }
            else d.number = cur_object++;
            d.name = c;
            nodes.push_back(d);

            num_object++;
        }
        // 'NumChannels': Number of envelope channels assigned to last layer
        else if ((*it).tokens[0] == "NumChannels") {
            // ignore for now
        }
        // 'Channel': preceedes any envelope description
        else if ((*it).tokens[0] == "Channel") {
            if (nodes.empty()) {
                if (motion_file) {

                    // LightWave motion file. Add dummy node
                    LWS::NodeDesc d;
                    d.type = LWS::NodeDesc::OBJECT;
                    d.name = c;
                    d.number = cur_object++;
                    nodes.push_back(d);
                }
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'Channel\'");
            }

            // important: index of channel
            nodes.back().channels.push_back(LWO::Envelope());
            LWO::Envelope& env = nodes.back().channels.back();

            env.index = strtoul10(c);

            // currently we can just interpret the standard channels 0...9
            // (hack) assume that index-i yields the binary channel type from LWO
            env.type = (LWO::EnvelopeType)(env.index+1);

        }
        // 'Envelope': a single animation channel
        else if ((*it).tokens[0] == "Envelope") {
            if (nodes.empty() || nodes.back().channels.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'Envelope\'");
            else {
                ReadEnvelope((*it),nodes.back().channels.back());
            }
        }
        // 'ObjectMotion': animation information for older lightwave formats
        else if (version < 3  && ((*it).tokens[0] == "ObjectMotion" ||
            (*it).tokens[0] == "CameraMotion" ||
            (*it).tokens[0] == "LightMotion")) {

            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'<Light|Object|Camera>Motion\'");
            else {
                ReadEnvelope_Old(it,root.children.end(),nodes.back(),version);
            }
        }
        // 'Pre/PostBehavior': pre/post animation behaviour for LWSC 2
        else if (version == 2 && (*it).tokens[0] == "Pre/PostBehavior") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'Pre/PostBehavior'");
            else {
                for (std::list<LWO::Envelope>::iterator it = nodes.back().channels.begin(); it != nodes.back().channels.end(); ++it) {
                    // two ints per envelope
                    LWO::Envelope& env = *it;
                    env.pre  = (LWO::PrePostBehaviour) strtoul10(c,&c); SkipSpaces(&c);
                    env.post = (LWO::PrePostBehaviour) strtoul10(c,&c); SkipSpaces(&c);
                }
            }
        }
        // 'ParentItem': specifies the parent of the current element
        else if ((*it).tokens[0] == "ParentItem") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'ParentItem\'");

            else nodes.back().parent = strtoul16(c,&c);
        }
        // 'ParentObject': deprecated one for older formats
        else if (version < 3 && (*it).tokens[0] == "ParentObject") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'ParentObject\'");

            else {
                nodes.back().parent = strtoul10(c,&c) | (1u << 28u);
            }
        }
        // 'AddCamera': add a camera to the scenegraph
        else if ((*it).tokens[0] == "AddCamera") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::CAMERA;

            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
            }
            else d.number = cur_camera++;
            nodes.push_back(d);

            num_camera++;
        }
        // 'CameraName': set name of currently active camera
        else if ((*it).tokens[0] == "CameraName") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::CAMERA)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'CameraName\'");

            else nodes.back().name = c;
        }
        // 'AddLight': add a light to the scenegraph
        else if ((*it).tokens[0] == "AddLight") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::LIGHT;

            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
            }
            else d.number = cur_light++;
            nodes.push_back(d);

            num_light++;
        }
        // 'LightName': set name of currently active light
        else if ((*it).tokens[0] == "LightName") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightName\'");

            else nodes.back().name = c;
        }
        // 'LightIntensity': set intensity of currently active light
        else if ((*it).tokens[0] == "LightIntensity" || (*it).tokens[0] == "LgtIntensity" ) {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightIntensity\'");

            else fast_atoreal_move<float>(c, nodes.back().lightIntensity );

        }
        // 'LightType': set type of currently active light
        else if ((*it).tokens[0] == "LightType") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightType\'");

            else nodes.back().lightType = strtoul10(c);

        }
        // 'LightFalloffType': set falloff type of currently active light
        else if ((*it).tokens[0] == "LightFalloffType") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightFalloffType\'");

            else nodes.back().lightFalloffType = strtoul10(c);

        }
        // 'LightConeAngle': set cone angle of currently active light
        else if ((*it).tokens[0] == "LightConeAngle") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightConeAngle\'");

            else nodes.back().lightConeAngle = fast_atof(c);

        }
        // 'LightEdgeAngle': set area where we're smoothing from min to max intensity
        else if ((*it).tokens[0] == "LightEdgeAngle") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightEdgeAngle\'");

            else nodes.back().lightEdgeAngle = fast_atof(c);

        }
        // 'LightColor': set color of currently active light
        else if ((*it).tokens[0] == "LightColor") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightColor\'");

            else {
                c = fast_atoreal_move<float>(c, (float&) nodes.back().lightColor.r );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().lightColor.g );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().lightColor.b );
            }
        }

        // 'PivotPosition': position of local transformation origin
        else if ((*it).tokens[0] == "PivotPosition" || (*it).tokens[0] == "PivotPoint") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'PivotPosition\'");
            else {
                c = fast_atoreal_move<float>(c, (float&) nodes.back().pivotPos.x );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().pivotPos.y );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().pivotPos.z );
                // Mark pivotPos as set
                nodes.back().isPivotSet = true;
            }
        }
    }

    // resolve parenting
    for (std::list<LWS::NodeDesc>::iterator it = nodes.begin(); it != nodes.end(); ++it) {

        // check whether there is another node which calls us a parent
        for (std::list<LWS::NodeDesc>::iterator dit = nodes.begin(); dit != nodes.end(); ++dit) {
            if (dit != it && *it == (*dit).parent) {
                if ((*dit).parent_resolved) {
                    // fixme: it's still possible to produce an overflow due to cross references ..
                    ASSIMP_LOG_ERROR("LWS: Found cross reference in scene-graph");
                    continue;
                }

                (*it).children.push_back(&*dit);
                (*dit).parent_resolved = &*it;
            }
        }
    }

    // find out how many nodes have no parent yet
    unsigned int no_parent = 0;
    for (std::list<LWS::NodeDesc>::iterator it = nodes.begin(); it != nodes.end(); ++it) {
        if (!(*it).parent_resolved)
            ++ no_parent;
    }
    if (!no_parent)
        throw DeadlyImportError("LWS: Unable to find scene root node");


    // Load all subsequent files
    batch.LoadAll();

    // and build the final output graph by attaching the loaded external
    // files to ourselves. first build a master graph
    aiScene* master = new aiScene();
    aiNode* nd = master->mRootNode = new aiNode();

    // allocate storage for cameras&lights
    if (num_camera) {
        master->mCameras = new aiCamera*[master->mNumCameras = num_camera];
    }
    aiCamera** cams = master->mCameras;
    if (num_light) {
        master->mLights = new aiLight*[master->mNumLights = num_light];
    }
    aiLight** lights = master->mLights;

    std::vector<AttachmentInfo> attach;
    std::vector<aiNodeAnim*> anims;

    nd->mName.Set("<LWSRoot>");
    nd->mChildren = new aiNode*[no_parent];
    for (std::list<LWS::NodeDesc>::iterator it = nodes.begin(); it != nodes.end(); ++it) {
        if (!(*it).parent_resolved) {
            aiNode* ro = nd->mChildren[ nd->mNumChildren++ ] = new aiNode();
            ro->mParent = nd;

            // ... and build the scene graph. If we encounter object nodes,
            // add then to our attachment table.
            BuildGraph(ro,*it, attach, batch, cams, lights, anims);
        }
    }

    // create a master animation channel for us
    if (anims.size()) {
        master->mAnimations = new aiAnimation*[master->mNumAnimations = 1];
        aiAnimation* anim = master->mAnimations[0] = new aiAnimation();
        anim->mName.Set("LWSMasterAnim");

        // LWS uses seconds as time units, but we convert to frames
        anim->mTicksPerSecond = fps;
        anim->mDuration = last-(first-1); /* fixme ... zero or one-based?*/

        anim->mChannels = new aiNodeAnim*[anim->mNumChannels = static_cast<unsigned int>(anims.size())];
        std::copy(anims.begin(),anims.end(),anim->mChannels);
    }

    // convert the master scene to RH
    MakeLeftHandedProcess monster_cheat;
    monster_cheat.Execute(master);

    // .. ccw
    FlipWindingOrderProcess flipper;
    flipper.Execute(master);

    // OK ... finally build the output graph
    SceneCombiner::MergeScenes(&pScene,master,attach,
        AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES    | (!configSpeedFlag ? (
        AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY | AI_INT_MERGE_SCENE_GEN_UNIQUE_MATNAMES) : 0));

    // Check flags
    if (!pScene->mNumMeshes || !pScene->mNumMaterials) {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;

        if (pScene->mNumAnimations && !noSkeletonMesh) {
            // construct skeleton mesh
            SkeletonMeshBuilder builder(pScene);
        }
    }

}